

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O3

Error __thiscall asmjit::v1_14::BaseEmitter::commentv(BaseEmitter *this,char *fmt,__va_list_tag *ap)

{
  ErrorHandler *pEVar1;
  Error _err;
  Error EVar2;
  char *pcVar3;
  ulong uVar4;
  undefined1 *puVar5;
  undefined8 local_448;
  ulong uStack_440;
  undefined8 local_438;
  undefined1 *local_430;
  undefined1 local_428 [1040];
  
  if ((this->_emitterFlags & kLogComments) == kNone) {
    EVar2 = 0;
    if ((this->_emitterFlags & kAttached) == kNone) {
      pEVar1 = this->_errorHandler;
      EVar2 = 5;
      if (pEVar1 != (ErrorHandler *)0x0) {
        pcVar3 = DebugUtils::errorAsString(5);
        (*pEVar1->_vptr_ErrorHandler[2])(pEVar1,5,pcVar3,this);
      }
    }
  }
  else {
    local_430 = local_428;
    uStack_440 = 0;
    local_448 = 0x20;
    local_438 = 0x407;
    local_428[0] = 0;
    EVar2 = String::_opVFormat((String *)&local_448,kAppend,fmt,ap);
    if (EVar2 == 0) {
      uVar4 = uStack_440;
      puVar5 = local_430;
      if ((local_448 & 0xff) < 0x1f) {
        uVar4 = local_448 & 0xff;
        puVar5 = (undefined1 *)((long)&local_448 + 1);
      }
      EVar2 = (*this->_vptr_BaseEmitter[0xf])(this,puVar5,uVar4);
    }
    String::reset((String *)&local_448);
  }
  return EVar2;
}

Assistant:

Error BaseEmitter::commentv(const char* fmt, va_list ap) {
  if (!hasEmitterFlag(EmitterFlags::kLogComments)) {
    if (!hasEmitterFlag(EmitterFlags::kAttached))
      return reportError(DebugUtils::errored(kErrorNotInitialized));
    return kErrorOk;
  }

#ifndef ASMJIT_NO_LOGGING
  StringTmp<1024> sb;
  Error err = sb.appendVFormat(fmt, ap);

  ASMJIT_PROPAGATE(err);
  return comment(sb.data(), sb.size());
#else
  DebugUtils::unused(fmt, ap);
  return kErrorOk;
#endif
}